

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O0

XPKEntry * XPKEntry_New(size_t width,size_t height,int x,int y)

{
  XPKEntry *entry;
  int y_local;
  int x_local;
  size_t height_local;
  size_t width_local;
  
  width_local = (size_t)malloc(0x20);
  if ((void *)width_local == (void *)0x0) {
    width_local = 0;
  }
  else {
    *(short *)(width_local + 0xc) = (short)width;
    *(short *)(width_local + 0xe) = (short)height;
    *(short *)(width_local + 0x10) = (short)x;
    *(short *)(width_local + 0x12) = (short)y;
    *(undefined8 *)(width_local + 0x18) = 0;
  }
  return (XPKEntry *)width_local;
}

Assistant:

XPKEntry *
XPKEntry_New(const size_t width, const size_t height, const int x, const int y)
{
	XPKEntry *entry = malloc(sizeof(XPKEntry)); /* XXX check for malloc error */
	if (!entry) {
		return NULL;
	}
	entry->width = width;
	entry->height = height;
	entry->x = x;
	entry->y = y;
	entry->data = NULL;
	return entry;
}